

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O0

void __thiscall Refal2::CRuleParser::afterDirection(CRuleParser *this)

{
  ulong uVar1;
  TLabel label;
  ulong uVar2;
  TChar *pTVar3;
  allocator local_71;
  string local_70 [32];
  ulong local_50;
  size_type i;
  allocator local_31;
  string local_30 [32];
  CRuleParser *local_10;
  CRuleParser *this_local;
  
  local_10 = this;
  switch((this->super_CQualifierParser).token.type) {
  case TT_Word:
    wordAfterDirection(this);
    break;
  case TT_Blank:
    break;
  case TT_Comma:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"unexpected token in the function rule",&local_31);
    error(this,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    break;
  case TT_Equal:
    CFunctionBuilder::AddEndOfLeft((CFunctionBuilder *)this);
    break;
  case TT_Label:
    label = CModuleBuilder::Declare((CModuleBuilder *)this,&(this->super_CQualifierParser).token);
    CFunctionBuilder::AddLabel((CFunctionBuilder *)this,label);
    break;
  case TT_Number:
    CFunctionBuilder::AddNumber
              ((CFunctionBuilder *)this,(this->super_CQualifierParser).token.number);
    break;
  case TT_String:
    for (local_50 = 0; uVar1 = local_50, uVar2 = std::__cxx11::string::length(), uVar1 < uVar2;
        local_50 = local_50 + 1) {
      pTVar3 = (TChar *)std::__cxx11::string::operator[]
                                  ((ulong)&(this->super_CQualifierParser).token.word);
      CFunctionBuilder::AddChar((CFunctionBuilder *)this,*pTVar3);
    }
    break;
  case TT_LineFeed:
    CFunctionBuilder::AddEndOfRight((CFunctionBuilder *)this);
    CParsingElementState::SetCorrect(&(this->super_CQualifierParser).super_CParsingElementState);
    break;
  case TT_Qualifier:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"unexpected qualifier in the function rule",&local_71);
    error(this,(string *)local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    break;
  case TT_LeftParen:
    CFunctionBuilder::AddLeftParen((CFunctionBuilder *)this);
    break;
  case TT_RightParen:
    CFunctionBuilder::AddRightParen((CFunctionBuilder *)this);
    break;
  case TT_LeftBracket:
    this->state = (TState)afterLeftBracket;
    *(undefined8 *)&this->field_0x1e80 = 0;
    CFunctionBuilder::AddLeftBracket((CFunctionBuilder *)this);
    break;
  case TT_RightBracket:
    CFunctionBuilder::AddRightBracket((CFunctionBuilder *)this);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                  ,0x90,"void Refal2::CRuleParser::afterDirection()");
  }
  return;
}

Assistant:

void CRuleParser::afterDirection()
{
	switch( token.type ) {
		case TT_Blank:
			break;
		case TT_Equal:
			CFunctionBuilder::AddEndOfLeft();
			break;
		case TT_Comma:
			error( "unexpected token in the function rule" );
			break;
		case TT_Label:
			CFunctionBuilder::AddLabel( CModuleBuilder::Declare( token ) );
			break;
		case TT_Number:
			CFunctionBuilder::AddNumber( token.number );
			break;
		case TT_String:
			for( std::string::size_type i = 0; i < token.word.length(); i++ ) {
				CFunctionBuilder::AddChar( token.word[i] );
			}
			break;
		case TT_Qualifier:
			error( "unexpected qualifier in the function rule" );
			break;
		case TT_LeftParen:
			CFunctionBuilder::AddLeftParen();
			break;
		case TT_RightParen:
			CFunctionBuilder::AddRightParen();
			break;
		case TT_LeftBracket:
			state = &CRuleParser::afterLeftBracket;
			CFunctionBuilder::AddLeftBracket();
			break;
		case TT_RightBracket:
			CFunctionBuilder::AddRightBracket();
			break;
		case TT_Word:
			wordAfterDirection();
			break;
		case TT_LineFeed:
			CFunctionBuilder::AddEndOfRight();
			SetCorrect();
			break;
		default:
			assert( false );
			break;
	}
}